

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O3

bool duckdb::CastDecimalCInternal<duckdb::interval_t>
               (duckdb_result *source,interval_t *result,idx_t col,idx_t row)

{
  PhysicalType PVar1;
  pointer pQVar2;
  reference type;
  NotImplementedException *this;
  size_type __dnew;
  size_type local_48;
  string local_40;
  
  pQVar2 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)source->internal_data);
  type = vector<duckdb::LogicalType,_true>::operator[](&(pQVar2->super_BaseQueryResult).types,col);
  DecimalType::GetWidth(type);
  DecimalType::GetScale(type);
  PVar1 = type->physical_type_;
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  if (PVar1 < INT64) {
    if (PVar1 == INT16) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_48 = 0x2a;
      local_40._M_dataplus._M_p =
           (pointer)::std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_48);
      local_40.field_2._M_allocated_capacity = local_48;
      builtin_strncpy(local_40._M_dataplus._M_p,"Unimplemented type for TryCastFromDecimal!",0x2a);
      local_40._M_string_length = local_48;
      local_40._M_dataplus._M_p[local_48] = '\0';
      NotImplementedException::NotImplementedException(this,&local_40);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (PVar1 == INT32) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_48 = 0x2a;
      local_40._M_dataplus._M_p =
           (pointer)::std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_48);
      local_40.field_2._M_allocated_capacity = local_48;
      builtin_strncpy(local_40._M_dataplus._M_p,"Unimplemented type for TryCastFromDecimal!",0x2a);
      local_40._M_string_length = local_48;
      local_40._M_dataplus._M_p[local_48] = '\0';
      NotImplementedException::NotImplementedException(this,&local_40);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (PVar1 == INT64) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_48 = 0x2a;
      local_40._M_dataplus._M_p =
           (pointer)::std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_48);
      local_40.field_2._M_allocated_capacity = local_48;
      builtin_strncpy(local_40._M_dataplus._M_p,"Unimplemented type for TryCastFromDecimal!",0x2a);
      local_40._M_string_length = local_48;
      local_40._M_dataplus._M_p[local_48] = '\0';
      NotImplementedException::NotImplementedException(this,&local_40);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (PVar1 == INT128) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_48 = 0x2a;
      local_40._M_dataplus._M_p =
           (pointer)::std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_48);
      local_40.field_2._M_allocated_capacity = local_48;
      builtin_strncpy(local_40._M_dataplus._M_p,"Unimplemented type for TryCastFromDecimal!",0x2a);
      local_40._M_string_length = local_48;
      local_40._M_dataplus._M_p[local_48] = '\0';
      NotImplementedException::NotImplementedException(this,&local_40);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Unimplemented internal type for decimal","");
  InternalException::InternalException((InternalException *)this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool CastDecimalCInternal(duckdb_result *source, RESULT_TYPE &result, idx_t col, idx_t row) {
	auto result_data = (duckdb::DuckDBResultData *)source->internal_data;
	auto &query_result = result_data->result;
	auto &source_type = query_result->types[col];
	auto width = duckdb::DecimalType::GetWidth(source_type);
	auto scale = duckdb::DecimalType::GetScale(source_type);
	void *source_address = UnsafeFetchPtr<hugeint_t>(source, col, row);

	CastParameters parameters;
	switch (source_type.InternalType()) {
	case duckdb::PhysicalType::INT16:
		return duckdb::TryCastFromDecimal::Operation<int16_t, RESULT_TYPE>(UnsafeFetchFromPtr<int16_t>(source_address),
		                                                                   result, parameters, width, scale);
	case duckdb::PhysicalType::INT32:
		return duckdb::TryCastFromDecimal::Operation<int32_t, RESULT_TYPE>(UnsafeFetchFromPtr<int32_t>(source_address),
		                                                                   result, parameters, width, scale);
	case duckdb::PhysicalType::INT64:
		return duckdb::TryCastFromDecimal::Operation<int64_t, RESULT_TYPE>(UnsafeFetchFromPtr<int64_t>(source_address),
		                                                                   result, parameters, width, scale);
	case duckdb::PhysicalType::INT128:
		return duckdb::TryCastFromDecimal::Operation<hugeint_t, RESULT_TYPE>(
		    UnsafeFetchFromPtr<hugeint_t>(source_address), result, parameters, width, scale);
	default:
		throw duckdb::InternalException("Unimplemented internal type for decimal");
	}
}